

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

ParseLocation __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocation
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  second_type *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ParseLocation PVar3;
  vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
  *locations;
  FieldDescriptor *pFStack_20;
  int index_local;
  FieldDescriptor *field_local;
  ParseInfoTree *this_local;
  
  pFStack_20 = field;
  field_local = (FieldDescriptor *)this;
  CheckFieldIndex(field,index);
  locations._4_4_ = index;
  if (index == -1) {
    locations._4_4_ = 0;
  }
  this_00 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>>>>>
                      (&this->locations_,&stack0xffffffffffffffe0);
  if ((this_00 != (second_type *)0x0) &&
     (sVar1 = std::
              vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
              ::size(this_00), (ulong)(long)locations._4_4_ < sVar1)) {
    pvVar2 = std::
             vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
             ::operator[](this_00,(long)locations._4_4_);
    PVar3.line = pvVar2->line;
    PVar3.column = pvVar2->column;
    return PVar3;
  }
  ParseLocation::ParseLocation((ParseLocation *)&this_local);
  return (ParseLocation)this_local;
}

Assistant:

TextFormat::ParseLocation TextFormat::ParseInfoTree::GetLocation(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) { index = 0; }

  const vector<TextFormat::ParseLocation>* locations =
      FindOrNull(locations_, field);
  if (locations == NULL || index >= locations->size()) {
    return TextFormat::ParseLocation();
  }

  return (*locations)[index];
}